

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchChoice.c
# Opt level: O0

int Dch_ObjMarkTfi_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  int RetValue;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  if (pObj == (Aig_Obj_t *)0x0) {
    p_local._4_4_ = 0;
  }
  else {
    iVar1 = Aig_ObjIsTravIdCurrent(p,pObj);
    if (iVar1 == 0) {
      iVar1 = Aig_ObjIsCi(pObj);
      if (iVar1 == 0) {
        iVar1 = Aig_ObjIsNode(pObj);
        if (iVar1 == 0) {
          __assert_fail("Aig_ObjIsNode(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchChoice.c"
                        ,0x80,"int Dch_ObjMarkTfi_rec(Aig_Man_t *, Aig_Obj_t *)");
        }
        Aig_ObjSetTravIdCurrent(p,pObj);
        pAVar3 = Aig_ObjFanin0(pObj);
        iVar1 = Dch_ObjMarkTfi_rec(p,pAVar3);
        pAVar3 = Aig_ObjFanin1(pObj);
        iVar2 = Dch_ObjMarkTfi_rec(p,pAVar3);
        p_local._4_4_ = (uint)(0 < iVar2 + iVar1);
      }
      else {
        iVar1 = Aig_ObjIsTravIdPrevious(p,pObj);
        p_local._4_4_ = (uint)((iVar1 != 0 ^ 0xffU) & 1);
        Aig_ObjSetTravIdCurrent(p,pObj);
      }
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Dch_ObjMarkTfi_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    int RetValue;
    if ( pObj == NULL )
        return 0;
    if ( Aig_ObjIsTravIdCurrent( p, pObj ) )
        return 0;
    if ( Aig_ObjIsCi(pObj) )
    {
        RetValue = !Aig_ObjIsTravIdPrevious( p, pObj );
        Aig_ObjSetTravIdCurrent( p, pObj );
        return RetValue;
    }
    assert( Aig_ObjIsNode(pObj) );
    Aig_ObjSetTravIdCurrent( p, pObj );
    RetValue  = Dch_ObjMarkTfi_rec( p, Aig_ObjFanin0(pObj) );
    RetValue += Dch_ObjMarkTfi_rec( p, Aig_ObjFanin1(pObj) );
//    RetValue += Dch_ObjMarkTfi_rec( p, Aig_ObjEquiv(p, pObj) );
    return (RetValue > 0);
}